

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::
strTree<char_const(&)[62],kj::StringPtr,char_const(&)[13],kj::StringPtr,char_const(&)[44],kj::Array<kj::StringTree>,char_const(&)[47],kj::StringTree>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [62],StringPtr *params_1,
          char (*params_2) [13],StringPtr *params_3,char (*params_4) [44],
          Array<kj::StringTree> *params_5,char (*params_6) [47],StringTree *params_7)

{
  ArrayDisposer *pAVar1;
  Branch *pBVar2;
  undefined8 uVar3;
  StringPtr delim;
  StringTree *params_7_00;
  ArrayPtr<const_char> local_c8;
  undefined1 local_b8 [24];
  ArrayDisposer *local_a0;
  Branch *pBStack_98;
  undefined8 *local_90;
  ArrayDisposer *local_88;
  undefined8 uStack_80;
  undefined8 *local_78;
  undefined1 local_70 [24];
  ArrayDisposer *local_58;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  
  local_b8._8_8_ = strlen((char *)this);
  local_c8.ptr = *(char **)*params;
  local_c8.size_ = *(long *)(*params + 8) - 1;
  local_b8._0_8_ = this;
  local_40.size_ = strlen((char *)params_1);
  local_50.ptr = *(char **)*params_2;
  local_50.size_ = *(long *)(*params_2 + 8) - 1;
  local_40.ptr = (char *)params_1;
  local_58 = (ArrayDisposer *)strlen((char *)params_3);
  delim.content.size_ = 1;
  delim.content.ptr = "";
  local_70._16_8_ = params_3;
  StringTree::StringTree((StringTree *)(local_b8 + 0x10),(Array<kj::StringTree> *)params_4,delim);
  params_7_00 = (StringTree *)0x1815b2;
  local_70._8_8_ = strlen((char *)params_5);
  local_70._0_8_ = params_5;
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree>
            (__return_storage_ptr__,(StringTree *)local_b8,&local_c8,&local_40,&local_50,
             (ArrayPtr<const_char> *)(local_70 + 0x10),(ArrayPtr<const_char> *)(local_b8 + 0x10),
             (StringTree *)local_70,(ArrayPtr<const_char> *)params_6,params_7_00);
  uVar3 = uStack_80;
  pAVar1 = local_88;
  if (local_88 != (ArrayDisposer *)0x0) {
    local_88 = (ArrayDisposer *)0x0;
    uStack_80 = 0;
    (**(code **)*local_78)
              (local_78,pAVar1,0x40,uVar3,uVar3,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  pBVar2 = pBStack_98;
  pAVar1 = local_a0;
  if (local_a0 != (ArrayDisposer *)0x0) {
    local_a0 = (ArrayDisposer *)0x0;
    pBStack_98 = (Branch *)0x0;
    (**(code **)*local_90)(local_90,pAVar1,1,pBVar2,pBVar2,0);
  }
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}